

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

RecyclerWeakReference<Js::Type> * __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Insert(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this,
      Type *key,bool value,bool add,bool checkForExisting)

{
  WeakRefDictionaryEntry<Js::Type,_bool> *pWVar1;
  Type *pTVar2;
  Recycler *recycler;
  hash_t bucket;
  uint uVar3;
  RecyclerWeakReferenceBase *weakRef;
  RecyclerWeakReference<Js::Type> *pRVar4;
  uint i;
  uint previous;
  uint key_00;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  bucket = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  if ((checkForExisting) && ((this->buckets).ptr != (int *)0x0)) {
    Memory::Recycler::IsSweeping(this->recycler);
    i = (this->buckets).ptr[bucket];
    if (-1 < (int)i) {
      previous = 0xffffffff;
      do {
        pWVar1 = (this->entries).ptr;
        if (pWVar1[i].hash == key_00) {
          pRVar4 = pWVar1[i].key.ptr;
          pTVar2 = (Type *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
          if (pTVar2 != (Type *)0x0) {
            if (pTVar2 == key) {
              if (add) {
                Js::Throw::FatalInternalError(-0x7fffbffb);
              }
              pWVar1[i].value = value;
              this->version = this->version + 1;
              return pRVar4;
            }
            goto LAB_007c4f78;
          }
          uVar3 = RemoveEntry(this,i,previous,bucket);
        }
        else {
LAB_007c4f78:
          uVar3 = pWVar1[i].next;
          previous = i;
        }
        i = uVar3;
      } while (-1 < (int)i);
    }
  }
  recycler = this->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)key,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&Js::Type::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  pRVar4 = Insert(this,(RecyclerWeakReference<Js::Type> *)weakRef,value,key_00,bucket);
  return pRVar4;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }